

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O0

void __thiscall VDasher::lineTo(VDasher *this,VPointF *p)

{
  undefined8 uVar1;
  VPointF VVar2;
  VPointF in_RSI;
  VLine *in_RDI;
  float length;
  VLine line;
  VLine right;
  VLine left;
  VLine *in_stack_ffffffffffffff78;
  VDasher *in_stack_ffffffffffffff80;
  VPointF *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float local_4c;
  VLine local_48;
  VLine local_30;
  VPointF local_10;
  
  local_10 = in_RSI;
  VLine::VLine((VLine *)&stack0xffffffffffffffe0);
  VLine::VLine(&local_30);
  VLine::VLine(in_RDI,in_stack_ffffffffffffff88,(VPointF *)in_stack_ffffffffffffff80);
  local_4c = VLine::length(&local_48);
  if (in_RDI[2].mX1 < local_4c) {
    while (in_RDI[2].mX1 <= local_4c && local_4c != in_RDI[2].mX1) {
      local_4c = local_4c - in_RDI[2].mX1;
      in_stack_ffffffffffffff80 = (VDasher *)&stack0xffffffffffffffe0;
      VLine::splitAtLength
                ((VLine *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,in_RDI,&local_48);
      VLine::p2(in_stack_ffffffffffffff78);
      addLine(in_stack_ffffffffffffff80,(VPointF *)in_stack_ffffffffffffff78);
      updateActiveSegment(in_stack_ffffffffffffff80);
      local_48.mX1 = local_30.mX1;
      local_48.mY1 = local_30.mY1;
      local_48.mX2 = local_30.mX2;
      local_48.mY2 = local_30.mY2;
      VVar2 = VLine::p1(in_stack_ffffffffffffff78);
      in_stack_ffffffffffffffa4 = VVar2.mx;
      in_RDI[1].mX1 = VVar2.mx;
      in_RDI[1].mY1 = VVar2.my;
    }
    if (0.1 < local_4c) {
      in_RDI[2].mX1 = in_RDI[2].mX1 - local_4c;
      VLine::p2(in_stack_ffffffffffffff78);
      addLine(in_stack_ffffffffffffff80,(VPointF *)in_stack_ffffffffffffff78);
    }
  }
  else {
    in_RDI[2].mX1 = in_RDI[2].mX1 - local_4c;
    addLine(in_stack_ffffffffffffff80,(VPointF *)in_stack_ffffffffffffff78);
  }
  if (in_RDI[2].mX1 <= 0.1 && in_RDI[2].mX1 != 0.1) {
    updateActiveSegment(in_stack_ffffffffffffff80);
  }
  uVar1 = *(undefined8 *)local_10;
  in_RDI[1].mX1 = (float)(int)uVar1;
  in_RDI[1].mY1 = (float)(int)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

void VDasher::lineTo(const VPointF &p)
{
    VLine left, right;
    VLine line(mCurPt, p);
    float length = line.length();

    if (length <= mCurrentLength) {
        mCurrentLength -= length;
        addLine(p);
    } else {
        while (length > mCurrentLength) {
            length -= mCurrentLength;
            line.splitAtLength(mCurrentLength, left, right);

            addLine(left.p2());
            updateActiveSegment();

            line = right;
            mCurPt = line.p1();
        }
        // handle remainder
        if (length > tolerance) {
            mCurrentLength -= length;
            addLine(line.p2());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = p;
}